

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O1

void cradix_rantala(LPPSTR a,UINT n)

{
  Stack *pSVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  size_t i_1;
  LPPSTR ta;
  LPBYTE __ptr;
  ulong *count_00;
  LPPSTR ppuVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  void *__src;
  uchar **a_00;
  ulong uVar12;
  ulong uVar13;
  UINT d;
  ulong uVar14;
  byte *__src_00;
  long lVar15;
  UINT count [256];
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  UINT local_1838;
  ulong local_1830 [255];
  LPPSTR local_1038;
  long alStack_1030 [255];
  byte *local_838 [257];
  
  ta = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n * 4);
  _sp->sa = a;
  _sp->sk = __ptr;
  _sp->sn = (int)n;
  pSVar1 = _sp + 1;
  piVar2 = &_sp->sb;
  _sp = pSVar1;
  *piVar2 = 0;
  memset(&local_1838,0,0x7f8);
  if (stack < pSVar1) {
    _sp = pSVar1;
    do {
      count_00 = &local_1838;
      pSVar1 = _sp + -1;
      a_00 = _sp[-1].sa;
      __src_00 = _sp[-1].sk;
      uVar4 = _sp[-1].sn;
      uVar14 = (ulong)(int)uVar4;
      iVar5 = _sp[-1].sb;
      d = (UINT)iVar5;
      _sp = pSVar1;
      if (__src_00 == (byte *)0x0) {
LAB_001d6101:
        RDFK(&local_1038,a_00,uVar14,ta,count_00,d);
      }
      else {
        uVar13 = d & 3;
        if (uVar13 == 0) {
          if (uVar4 < 0x81) goto LAB_001d6101;
          uVar8 = 0;
          pbVar10 = __src_00;
          do {
            puVar6 = a_00[uVar8];
            lVar15 = 0;
            do {
              bVar3 = puVar6[lVar15 + d];
              pbVar10[lVar15] = bVar3;
              if (bVar3 == 0) {
                pbVar10[lVar15] = 0;
                break;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            uVar8 = uVar8 + 1;
            pbVar10 = pbVar10 + 4;
          } while (uVar8 != uVar14);
          uVar8 = 0;
          do {
            (&local_1838)[__src_00[uVar8 * 4]] = (&local_1838)[__src_00[uVar8 * 4]] + 1;
            uVar8 = uVar8 + 1;
          } while (uVar14 != uVar8);
        }
        else if (uVar4 != 0) {
          uVar8 = uVar14;
          pbVar10 = __src_00;
          do {
            (&local_1838)[*pbVar10] = (&local_1838)[*pbVar10] + 1;
            pbVar10 = pbVar10 + (4 - uVar13);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        do {
          uVar8 = *count_00;
          count_00 = count_00 + 1;
        } while (uVar8 == 0);
        uVar11 = 0;
        if (uVar8 < uVar14) {
          uVar11 = uVar14;
        }
        uVar12 = uVar13 ^ 3;
        local_1038 = a_00;
        local_838[0] = __src_00;
        lVar15 = 0;
        ppuVar7 = a_00;
        pbVar10 = __src_00;
        do {
          ppuVar7 = ppuVar7 + (&local_1838)[lVar15];
          alStack_1030[lVar15] = (long)ppuVar7;
          pbVar10 = pbVar10 + (&local_1838)[lVar15] * uVar12;
          local_838[lVar15 + 1] = pbVar10;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0xff);
        lVar15 = 4 - uVar13;
        memcpy(ta,a_00,uVar11 * 8);
        if (uVar8 < uVar14) {
          lVar9 = 0;
          pbVar10 = __src_00;
          do {
            *(uchar **)alStack_1030[(ulong)*pbVar10 - 1] = ta[lVar9];
            alStack_1030[(ulong)*pbVar10 - 1] = alStack_1030[(ulong)*pbVar10 - 1] + 8;
            lVar9 = lVar9 + 1;
            pbVar10 = pbVar10 + lVar15;
          } while (uVar11 + (uVar11 == 0) != lVar9);
        }
        memcpy(ta,__src_00,lVar15 * uVar14);
        if (uVar4 != 0) {
          __src = (void *)((long)ta + 1);
          do {
            bVar3 = *(byte *)((long)__src + -1);
            pbVar10 = local_838[bVar3];
            if ((int)uVar13 != 3) {
              memcpy(pbVar10,__src,uVar12 + (uVar12 == 0));
            }
            local_838[bVar3] = pbVar10 + uVar12;
            __src = (void *)((long)__src + lVar15);
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        lVar15 = 0;
        do {
          if ((lVar15 == 0) || (uVar14 = (&local_1838)[lVar15], uVar14 < 0x15)) {
            if (1 < (&local_1838)[lVar15] && lVar15 != 0) {
              insertion_sort(a_00,(int)(&local_1838)[lVar15],d);
            }
          }
          else {
            _sp->sa = a_00;
            _sp->sk = __src_00;
            _sp->sn = (int)uVar14;
            piVar2 = &_sp->sb;
            _sp = _sp + 1;
            *piVar2 = iVar5 + 1;
          }
          a_00 = a_00 + (&local_1838)[lVar15];
          __src_00 = __src_00 + (&local_1838)[lVar15] * uVar12;
          (&local_1838)[lVar15] = 0;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0xff);
      }
    } while (stack < _sp);
  }
  free(ta);
  free(__ptr);
  return;
}

Assistant:

void cradix_rantala(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					insertion_sort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}